

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O0

void __thiscall wasm::MergeBlocks::visitExpression(MergeBlocks *this,Expression *curr)

{
  pointer *this_00;
  Expression *pEVar1;
  Block *this_01;
  bool bVar2;
  Expression **ppEVar4;
  size_t sVar5;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAVar6;
  bool bVar3;
  reference other;
  PassOptions *pPVar7;
  Module *pMVar8;
  optional<wasm::Type> type_;
  Iterator IVar9;
  Iterator IVar10;
  undefined1 local_2c8 [12];
  Expression *local_2b8;
  Expression *blockChild_1;
  Iterator __end4_1;
  Iterator __begin4_1;
  ExpressionList *__range4_1;
  EffectAnalyzer *effects;
  iterator __end4;
  iterator __begin4;
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *__range4;
  EffectAnalyzer blockChildEffects;
  Expression *blockChild;
  Iterator __end3;
  Iterator __begin3;
  ExpressionList *__range3;
  Expression *pEStack_d0;
  bool fail;
  Expression *back;
  anon_class_24_3_515ba06b continueEarly;
  Block *block;
  Expression *child;
  Block *pBStack_98;
  Index i_1;
  Block *outerBlock;
  undefined1 local_88 [8];
  Index i;
  Index lastBlock;
  Index numChildren;
  undefined1 local_70 [8];
  ChildIterator iterator;
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> childEffects;
  Expression *curr_local;
  MergeBlocks *this_local;
  
  bVar2 = Properties::isControlFlowStructure(curr);
  if (!bVar2) {
    std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::vector
              ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
               ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data + 0x10));
    ChildIterator::ChildIterator((ChildIterator *)local_70,curr);
    i = AbstractChildIterator<wasm::ChildIterator>::getNumChildren
                  ((AbstractChildIterator<wasm::ChildIterator> *)local_70);
    local_88._4_4_ = 0xffffffff;
    for (local_88._0_4_ = 0; (uint)local_88._0_4_ < i; local_88._0_4_ = local_88._0_4_ + 1) {
      ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::getChild
                          ((AbstractChildIterator<wasm::ChildIterator> *)local_70,local_88._0_4_);
      bVar2 = Expression::is<wasm::Block>(*ppEVar4);
      if (bVar2) {
        local_88._4_4_ = local_88._0_4_;
      }
    }
    if (local_88._4_4_ == 0xffffffff) {
      outerBlock._4_4_ = 1;
    }
    else {
      if (local_88._4_4_ != 0) {
        std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::reserve
                  ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
                   ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                           flexible.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data + 0x10),(ulong)(uint)local_88._4_4_);
      }
      pBStack_98 = (Block *)0x0;
      for (child._4_4_ = 0; child._4_4_ <= (uint)local_88._4_4_; child._4_4_ = child._4_4_ + 1) {
        ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::getChild
                            ((AbstractChildIterator<wasm::ChildIterator> *)local_70,child._4_4_);
        block = (Block *)*ppEVar4;
        continueEarly.child = (Expression **)Expression::dynCast<wasm::Block>((Expression *)block);
        back = (Expression *)
               ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data + 0x10);
        continueEarly.this = (MergeBlocks *)&block;
        continueEarly.childEffects =
             (vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)this;
        if ((((Block *)continueEarly.child == (Block *)0x0) ||
            (bVar2 = IString::is(&(((Block *)continueEarly.child)->name).super_IString), bVar2)) ||
           (sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)(continueEarly.child + 4)), sVar5 < 2)) {
          visitExpression::anon_class_24_3_515ba06b::operator()((anon_class_24_3_515ba06b *)&back);
        }
        else {
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)(continueEarly.child + 4));
          pEStack_d0 = *ppEVar4;
          bVar2 = wasm::Type::operator!=((Type *)(continueEarly.child + 1),&pEStack_d0->type);
          if (bVar2) {
            visitExpression::anon_class_24_3_515ba06b::operator()((anon_class_24_3_515ba06b *)&back)
            ;
          }
          else {
            bVar2 = false;
            pAVar6 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (continueEarly.child + 4);
            IVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                              (pAVar6);
            __end3.index = (size_t)IVar9.parent;
            IVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                              (pAVar6);
            while( true ) {
              __end3.parent = (ArenaVector<wasm::Expression_*> *)IVar9.index;
              blockChild = (Expression *)IVar9.parent;
              bVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator
                      ::operator!=((Iterator *)&__end3.index,(Iterator *)&blockChild);
              if (!bVar3) break;
              ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        Iterator::operator*((Iterator *)&__end3.index);
              blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)*ppEVar4;
              if ((Expression *)
                  blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                  == pEStack_d0) break;
              pPVar7 = Pass::getPassOptions((Pass *)this);
              pMVar8 = Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       ::getModule(&(this->
                                    super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                                    .
                                    super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                                  );
              EffectAnalyzer::EffectAnalyzer
                        ((EffectAnalyzer *)&__range4,pPVar7,pMVar8,
                         (Expression *)
                         blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count);
              this_00 = (pointer *)
                        ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data + 0x10);
              __end4 = std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::
                       begin((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
                             this_00);
              effects = (EffectAnalyzer *)
                        std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::
                        end((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
                            this_00);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&__end4,(__normal_iterator<wasm::EffectAnalyzer_*,_std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>_>
                                                 *)&effects), bVar3) {
                other = __gnu_cxx::
                        __normal_iterator<wasm::EffectAnalyzer_*,_std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>_>
                        ::operator*(&__end4);
                bVar3 = EffectAnalyzer::invalidates((EffectAnalyzer *)&__range4,other);
                if (bVar3) {
                  bVar2 = true;
                  break;
                }
                __gnu_cxx::
                __normal_iterator<wasm::EffectAnalyzer_*,_std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>_>
                ::operator++(&__end4);
              }
              if (bVar2) {
                outerBlock._4_4_ = 8;
              }
              else {
                outerBlock._4_4_ = 0;
              }
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&__range4);
              if (outerBlock._4_4_ != 0) break;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator++((Iterator *)&__end3.index);
              IVar9.index = (size_t)__end3.parent;
              IVar9.parent = (ArenaVector<wasm::Expression_*> *)blockChild;
            }
            if (bVar2) {
              visitExpression::anon_class_24_3_515ba06b::operator()
                        ((anon_class_24_3_515ba06b *)&back);
            }
            else {
              if (pBStack_98 == (Block *)0x0) {
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (continueEarly.child + 4));
                pBStack_98 = (Block *)continueEarly.child;
              }
              else {
                pAVar6 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (continueEarly.child + 4);
                IVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                                  (pAVar6);
                __end4_1.index = (size_t)IVar9.parent;
                IVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                                   (pAVar6);
                while( true ) {
                  __end4_1.parent = (ArenaVector<wasm::Expression_*> *)IVar10.index;
                  blockChild_1 = (Expression *)IVar10.parent;
                  bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                          Iterator::operator!=
                                    ((Iterator *)&__end4_1.index,(Iterator *)&blockChild_1);
                  if (!bVar2) break;
                  ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            Iterator::operator*((Iterator *)&__end4_1.index);
                  local_2b8 = *ppEVar4;
                  if (local_2b8 == pEStack_d0) break;
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            (&(pBStack_98->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,local_2b8);
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator++((Iterator *)&__end4_1.index);
                  IVar10.index = (size_t)__end4_1.parent;
                  IVar10.parent = (ArenaVector<wasm::Expression_*> *)blockChild_1;
                }
              }
              pEVar1 = pEStack_d0;
              ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::getChild
                                  ((AbstractChildIterator<wasm::ChildIterator> *)local_70,
                                   child._4_4_);
              *ppEVar4 = pEVar1;
              if (child._4_4_ < (uint)local_88._4_4_) {
                pPVar7 = Pass::getPassOptions((Pass *)this);
                pMVar8 = Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         ::getModule(&(this->
                                      super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                                      ).
                                      super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                                      .
                                      super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                                    );
                std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                          ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                           ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.
                                   children.flexible.
                                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                   ._M_impl.super__Vector_impl_data + 0x10),pPVar7,pMVar8,
                           &stack0xffffffffffffff30);
              }
            }
          }
        }
      }
      if (pBStack_98 != (Block *)0x0) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBStack_98->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,curr)
        ;
        this_01 = pBStack_98;
        std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                  ((optional<wasm::Type> *)local_2c8,&curr->type);
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._12_4_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)local_2c8._0_8_;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_2c8[8];
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_3_ = local_2c8._9_3_;
        Block::finalize(this_01,type_,Unknown);
        Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
        replaceCurrent(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                        ).
                        super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                        .
                        super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       ,(Expression *)pBStack_98);
        this->refinalize = true;
      }
      outerBlock._4_4_ = 0;
    }
    ChildIterator::~ChildIterator((ChildIterator *)local_70);
    std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
              ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
               ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data + 0x10));
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Control flow need special handling. Those we can optimize are handled
    // below.
    if (Properties::isControlFlowStructure(curr)) {
      return;
    }

    // As we go through the children, to move things to the outside means
    // moving them past the children before them:
    //
    //  (parent
    //   (child1
    //    (A)
    //    (B)
    //   )
    //   (child2
    //
    // If we move (A) out of parent, then that is fine (further things moved
    // out would appear after it). But if we leave (B) in its current position
    // then if we try to move anything from child2 out of parent then we must
    // move those things past (B). We use a vector to track the effects of the
    // children, where it contains the effects of what was left in the child
    // after optimization.
    std::vector<EffectAnalyzer> childEffects;

    ChildIterator iterator(curr);
    auto numChildren = iterator.getNumChildren();

    // Find the last block among the children, as all we are trying to do here
    // is move the contents of blocks outwards.
    Index lastBlock = -1;
    for (Index i = 0; i < numChildren; i++) {
      if (iterator.getChild(i)->is<Block>()) {
        lastBlock = i;
      }
    }
    if (lastBlock == Index(-1)) {
      // There are no blocks at all, so there is nothing to optimize.
      return;
    }

    // We'll only compute effects up to the child before the last block, since
    // we have nothing to optimize afterwards, which sets a maximum size on the
    // vector.
    if (lastBlock > 0) {
      childEffects.reserve(lastBlock);
    }

    // The outer block that will replace us, containing the contents moved out
    // and then ourselves, assuming we manage to optimize.
    Block* outerBlock = nullptr;

    for (Index i = 0; i <= lastBlock; i++) {
      auto* child = iterator.getChild(i);
      auto* block = child->dynCast<Block>();

      auto continueEarly = [&]() {
        // When we continue early, after failing to find anything to optimize,
        // the effects we need to note for the child are simply those of the
        // child in its original form.
        childEffects.emplace_back(getPassOptions(), *getModule(), child);
      };

      // If there is no block, or it is one that might have branches, or it is
      // too small for us to remove anything from (we cannot remove the last
      // element), or if it has unreachable code (leave that for dce), then give
      // up.
      if (!block || block->name.is() || block->list.size() <= 1) {
        continueEarly();
        continue;
      }

      // Also give up if the block's last element has a different type than the
      // block, as that would mean we would change the type received by the
      // parent (which might cause its type to need to be updated, for example).
      // Leave this alone, as other passes will simplify this anyhow (using
      // refinalize).
      auto* back = block->list.back();
      if (block->type != back->type) {
        continueEarly();
        continue;
      }

      // The block seems to have the shape we want. Check for effects: we want
      // to move all the items out but the last one, so they must all cross over
      // anything we need to move past.
      //
      // In principle we could also handle the case where we can move out only
      // some of the block items. However, that would be more complex (we'd need
      // to allocate a new block sometimes), it is rare, and it may not always
      // be helpful (we wouldn't actually be getting rid of the child block -
      // although, in the binary format such blocks tend to vanish anyhow).
      bool fail = false;
      for (auto* blockChild : block->list) {
        if (blockChild == back) {
          break;
        }
        EffectAnalyzer blockChildEffects(
          getPassOptions(), *getModule(), blockChild);
        for (auto& effects : childEffects) {
          if (blockChildEffects.invalidates(effects)) {
            fail = true;
            break;
          }
        }
        if (fail) {
          break;
        }
      }
      if (fail) {
        continueEarly();
        continue;
      }

      // Wonderful, we can do this! Move our items to an outer block, reusing
      // this one if there isn't one already.
      if (!outerBlock) {
        // Leave all the items there, just remove the last one which will remain
        // where it was.
        block->list.pop_back();
        outerBlock = block;
      } else {
        // Move the items to the existing outer block.
        for (auto* blockChild : block->list) {
          if (blockChild == back) {
            break;
          }
          outerBlock->list.push_back(blockChild);
        }
      }

      // Set the back element as the new child, replacing the block that was
      // there.
      iterator.getChild(i) = back;

      // If there are further elements, we need to know what effects the
      // remaining code has, as if they move they'll move past it.
      if (i < lastBlock) {
        childEffects.emplace_back(getPassOptions(), *getModule(), back);
      }
    }

    if (outerBlock) {
      // We moved items outside, which means we must replace ourselves with the
      // block.
      outerBlock->list.push_back(curr);
      outerBlock->finalize(curr->type);
      replaceCurrent(outerBlock);
      refinalize = true;
    }
  }